

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O1

void loop_undo(jit_State *J,IRRef ins,SnapNo nsnap,MSize nsnapmap)

{
  byte *pbVar1;
  SnapShot *pSVar2;
  SnapEntry *pSVar3;
  long lVar4;
  ulong uVar5;
  
  pSVar2 = (J->cur).snap;
  pSVar3 = (J->cur).snapmap;
  pSVar3[(uint)pSVar2[nsnap - 1].nent + pSVar2[nsnap - 1].mapofs] = pSVar3[pSVar2->nent];
  (J->cur).nsnapmap = nsnapmap;
  (J->cur).nsnap = (uint16_t)nsnap;
  (J->guardemit).irt = '\0';
  lj_ir_rollback(J,ins);
  lVar4 = 0;
  do {
    if (ins <= J->bpropcache[lVar4].val) {
      J->bpropcache[lVar4].key = 0;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  if (0x8000 < ins - 1) {
    uVar5 = (ulong)(ins - 1);
    do {
      pbVar1 = (byte *)((long)(J->cur).ir + uVar5 * 8 + 4);
      *pbVar1 = *pbVar1 & 0x9f;
      uVar5 = uVar5 - 1;
    } while (0x8000 < (uint)uVar5);
  }
  return;
}

Assistant:

static void loop_undo(jit_State *J, IRRef ins, SnapNo nsnap, MSize nsnapmap)
{
  ptrdiff_t i;
  SnapShot *snap = &J->cur.snap[nsnap-1];
  SnapEntry *map = J->cur.snapmap;
  map[snap->mapofs + snap->nent] = map[J->cur.snap[0].nent];  /* Restore PC. */
  J->cur.nsnapmap = (uint32_t)nsnapmap;
  J->cur.nsnap = nsnap;
  J->guardemit.irt = 0;
  lj_ir_rollback(J, ins);
  for (i = 0; i < BPROP_SLOTS; i++) {  /* Remove backprop. cache entries. */
    BPropEntry *bp = &J->bpropcache[i];
    if (bp->val >= ins)
      bp->key = 0;
  }
  for (ins--; ins >= REF_FIRST; ins--) {  /* Remove flags. */
    IRIns *ir = IR(ins);
    irt_clearphi(ir->t);
    irt_clearmark(ir->t);
  }
}